

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

FilterPropagateResult duckdb::CheckRowIdFilter(TableFilter *filter,idx_t beg_row,idx_t end_row)

{
  int iVar1;
  NumericStatsData *pNVar2;
  BaseStatistics dummy_stats;
  LogicalType local_90;
  BaseStatistics local_78;
  
  LogicalType::LogicalType(&local_90,BIGINT);
  NumericStats::CreateEmpty(&local_78,&local_90);
  LogicalType::~LogicalType(&local_90);
  pNVar2 = NumericStats::GetDataUnsafe(&local_78);
  pNVar2->has_min = true;
  (pNVar2->min).value_.ubigint = beg_row;
  pNVar2 = NumericStats::GetDataUnsafe(&local_78);
  pNVar2->has_max = true;
  (pNVar2->max).value_.ubigint = end_row;
  iVar1 = (*filter->_vptr_TableFilter[2])(filter,&local_78);
  BaseStatistics::~BaseStatistics(&local_78);
  return (FilterPropagateResult)iVar1;
}

Assistant:

static FilterPropagateResult CheckRowIdFilter(TableFilter &filter, idx_t beg_row, idx_t end_row) {
	// RowId columns dont have a zonemap, but we can trivially create stats to check the filter against.
	BaseStatistics dummy_stats = NumericStats::CreateEmpty(LogicalType::ROW_TYPE);
	NumericStats::SetMin(dummy_stats, UnsafeNumericCast<row_t>(beg_row));
	NumericStats::SetMax(dummy_stats, UnsafeNumericCast<row_t>(end_row));

	return filter.CheckStatistics(dummy_stats);
}